

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> * __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>
::GetConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                *this,int i)

{
  _Elt_pointer pCVar1;
  ulong uVar2;
  
  pCVar1 = (this->cons_).
           super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar2 = ((long)pCVar1 -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x7b425ed097b425ed +
          (long)i;
  if (uVar2 < 2) {
    return (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
           (pCVar1 + i);
  }
  return (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
         ((this->cons_).
          super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>::Container>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node[uVar2 >> 1] + uVar2 + (uVar2 >> 1) * -2);
}

Assistant:

const Constraint& GetConstraint(int i) const
  { assert(check_index(i)); return cons_[i].GetCon(); }